

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

string_stream * __thiscall
argh::parser::operator()(string_stream *__return_storage_ptr__,parser *this,size_t ind,int *def_val)

{
  pointer pbVar1;
  ostringstream ostr;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  pbVar1 = (this->pos_args_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ind < (ulong)((long)(this->pos_args_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)__return_storage_ptr__,(string *)(pbVar1 + ind),_S_in);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x15;
    std::ostream::operator<<((ostringstream *)&local_190,*def_val);
    std::__cxx11::stringbuf::str();
    std::__cxx11::istringstream::istringstream
              ((istringstream *)__return_storage_ptr__,(string *)local_1b0,_S_in);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

string_stream parser::operator()(size_t ind, T&& def_val) const
   {
      if (pos_args_.size() <= ind)
      {
         std::ostringstream ostr;
         ostr.precision(std::numeric_limits<long double>::max_digits10);
         ostr << def_val;
         return string_stream(ostr.str());
      }

      return string_stream(pos_args_[ind]);
   }